

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O0

bool __thiscall GNUmakeTokenPool::Acquire(GNUmakeTokenPool *this)

{
  uint uVar1;
  GNUmakeTokenPool *this_local;
  
  if (this->available_ < 1) {
    uVar1 = (*(this->super_TokenPool)._vptr_TokenPool[10])();
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this->available_ = this->available_ + 1;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GNUmakeTokenPool::Acquire() {
  if (available_ > 0)
    return true;

  if (AcquireToken()) {
    // token acquired
    available_++;
    return true;
  }

  // no token available
  return false;
}